

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent
          (HierarchicalTaskNetworkComponent *this,Actor *owner)

{
  result_type_conflict rVar1;
  mapped_type *pmVar2;
  key_type local_13d0;
  undefined4 local_13cc;
  undefined4 uStack_13c8;
  float local_13c4;
  key_type local_13c0;
  undefined4 local_13bc;
  undefined4 uStack_13b8;
  float local_13b4;
  random_device local_13b0;
  Actor *local_18;
  Actor *owner_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  local_18 = owner;
  owner_local = (Actor *)this;
  Component::Component(&this->super_Component,owner);
  IFixedTickable::IFixedTickable(&this->super_IFixedTickable);
  (this->super_Component)._vptr_Component = (_func_int **)&PTR_initializeComponent_0022dd10;
  (this->super_IFixedTickable)._vptr_IFixedTickable = (_func_int **)&DAT_0022dd30;
  this->frameCount = 0;
  Planner::Planner(&this->planner);
  WorldState::WorldState(&this->state);
  std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::deque(&this->taskHistory);
  std::random_device::random_device(&local_13b0);
  rVar1 = std::random_device::operator()(&local_13b0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->eng,(ulong)rVar1);
  std::random_device::~random_device(&local_13b0);
  std::vector<AI::Utility,_std::allocator<AI::Utility>_>::vector(&this->utilities);
  __gnu_cxx::
  __normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>::
  __normal_iterator(&this->utilityIterator);
  std::__cxx11::string::string((string *)&this->currentGoalName);
  std::__cxx11::string::string((string *)&this->currentTaskName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->planPath);
  Barker::Barker(&this->barker);
  std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::vector(&this->utilityScores)
  ;
  this->detailSightRadius = 800.0;
  this->motionSightRadius = 1600.0;
  this->detailAngle = 20.0;
  this->motionAngle = this->detailAngle + this->detailAngle;
  local_13bc = 0;
  uStack_13b8 = 0;
  local_13b4 = 0.0;
  local_13c0 = CurrentPosition;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,&local_13c0);
  pmVar2->z = local_13b4;
  pmVar2->x = (float)local_13bc;
  pmVar2->y = (float)uStack_13b8;
  local_13cc = 0x447a0000;
  uStack_13c8 = 0x447a0000;
  local_13c4 = 1000.0;
  local_13d0 = PlayerPosition;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,&local_13d0);
  pmVar2->z = local_13c4;
  pmVar2->x = (float)local_13cc;
  pmVar2->y = (float)uStack_13c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->planPath,5);
  return;
}

Assistant:

HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent(Actor* owner)
	: Component(owner)
{
	detailSightRadius = 800.f;
	motionSightRadius = 1600.f;

	detailAngle = 20.f;
	motionAngle = detailAngle * 2.f;

	state.current.vectors[WorldStateIdentifier::CurrentPosition] = {};
	state.current.vectors[WorldStateIdentifier::PlayerPosition] = {1000, 1000, 1000};

	planPath.resize(5);
}